

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

ostream * nlohmann::operator<<
                    (ostream *o,
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *j)

{
  streamsize sVar1;
  output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  ostream *in_RDI;
  serializer s;
  streamsize indentation;
  bool pretty_print;
  output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffd08;
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_00;
  undefined7 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd1f;
  error_handler_t in_stack_fffffffffffffd60;
  char in_stack_fffffffffffffd67;
  output_adapter_t<char> *in_stack_fffffffffffffd68;
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffd70;
  uint in_stack_fffffffffffffdbc;
  uint in_stack_fffffffffffffdc0;
  char in_stack_fffffffffffffdc6;
  char in_stack_fffffffffffffdc7;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffdc8;
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffdd0;
  
  sVar1 = std::ios_base::width((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  if (sVar1 < 1) {
    this = (output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x0;
  }
  else {
    this = (output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::ios_base::width((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  }
  std::ios_base::width((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)),0);
  this_00 = (serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             *)&stack0xfffffffffffffd38;
  detail::
  output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::output_adapter(this,(basic_ostream<char,_std::char_traits<char>_> *)
                        CONCAT17(in_stack_fffffffffffffd1f,in_stack_fffffffffffffd18));
  detail::output_adapter::operator_cast_to_shared_ptr(in_stack_fffffffffffffd08);
  std::ios::fill();
  detail::
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::serializer(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd67,
               in_stack_fffffffffffffd60);
  std::shared_ptr<nlohmann::detail::output_adapter_protocol<char>_>::~shared_ptr
            ((shared_ptr<nlohmann::detail::output_adapter_protocol<char>_> *)0x149db8);
  detail::
  output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~output_adapter((output_adapter<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x149dc2);
  detail::
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::dump(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,(bool)in_stack_fffffffffffffdc7,
         (bool)in_stack_fffffffffffffdc6,in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc);
  detail::
  serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::~serializer(this_00);
  return in_RDI;
}

Assistant:

friend std::ostream& operator<<(std::ostream& o, const basic_json& j)
    {
        // read width member and use it as indentation parameter if nonzero
        const bool pretty_print = o.width() > 0;
        const auto indentation = pretty_print ? o.width() : 0;

        // reset width to 0 for subsequent calls to this stream
        o.width(0);

        // do the actual serialization
        serializer s(detail::output_adapter<char>(o), o.fill());
        s.dump(j, pretty_print, false, static_cast<unsigned int>(indentation));
        return o;
    }